

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O0

int pop_mem(em8051 *aCPU)

{
  uint uVar1;
  int iVar2;
  int address;
  em8051 *aCPU_local;
  
  uVar1 = (uint)aCPU->mCodeMem[(int)(aCPU->mPC + 1U & aCPU->mCodeMemSize - 1U)];
  if (uVar1 < 0x80) {
    iVar2 = pop_from_stack(aCPU);
    aCPU->mLowerData[(int)uVar1] = (uchar)iVar2;
  }
  else {
    iVar2 = pop_from_stack(aCPU);
    aCPU->mSFR[(int)(uVar1 - 0x80)] = (uchar)iVar2;
    if (aCPU->sfrwrite != (em8051sfrwrite)0x0) {
      (*aCPU->sfrwrite)(aCPU,uVar1);
    }
  }
  aCPU->mPC = aCPU->mPC + 2;
  return 1;
}

Assistant:

static int pop_mem(struct em8051 *aCPU)
{
    int address = OPERAND1;
    if (address > 0x7f)
    {
        aCPU->mSFR[address - 0x80] = pop_from_stack(aCPU);
        if (aCPU->sfrwrite)
            aCPU->sfrwrite(aCPU, address);
    }
    else
    {
        aCPU->mLowerData[address] = pop_from_stack(aCPU);
    }

    PC += 2;
    return 1;
}